

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O2

void handle_resize(void)

{
  gamewin *pgVar1;
  WINDOW *pWVar2;
  int iVar3;
  gamewin **ppgVar4;
  
  ppgVar4 = &firstgw;
  while (pgVar1 = *ppgVar4, pgVar1 != (gamewin *)0x0) {
    if (pgVar1->resize != (_func_void_gamewin_ptr *)0x0) {
      (*pgVar1->resize)(pgVar1);
      pWVar2 = pgVar1->win;
      iVar3 = -1;
      if (pWVar2 != (WINDOW *)0x0) {
        iVar3 = pWVar2->_maxy + 1;
      }
      wredrawln(pWVar2,0,iVar3);
      wnoutrefresh(pgVar1->win);
    }
    ppgVar4 = &pgVar1->next;
  }
  rebuild_ui();
  doupdate();
  return;
}

Assistant:

void handle_resize(void)
{
    struct gamewin *gw;

    for (gw = firstgw; gw; gw = gw->next) {
	if (!gw->resize)
	    continue;

	gw->resize(gw);
	redrawwin(gw->win);
	wnoutrefresh(gw->win);
    }

    rebuild_ui();
    doupdate();
}